

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void __thiscall SNexFile::finalizeFile(SNexFile *this)

{
  int local_18;
  byte local_11;
  int i;
  byte hasExtendedBank;
  SNexFile *this_local;
  
  if (this->f != (FILE *)0x0) {
    if ((this->minFileVersion == 3) && (this->reqFileVersion == 2)) {
      Error("[SAVENEX] V1.3?!",(char *)0x0,FATAL);
    }
    updateIfAheadFirstBankSave(this);
    if (this->minFileVersion == 2) {
      (this->h).banksOffset = 0;
      (this->h).bigL2barPosY = '\0';
    }
    else {
      (this->h).magicAndVersion[7] = '3';
      calculateCrc32C(this);
    }
    writeHeader(this);
    fclose((FILE *)this->f);
    this->f = (FILE *)0x0;
    this->canAppend = false;
    if ((this->copper != (byte *)0x0) && (this->copper != (byte *)0x0)) {
      operator_delete__(this->copper);
    }
    this->copper = (byte *)0x0;
    if ((this->palette != (byte *)0x0) && (this->palette != (byte *)0x0)) {
      operator_delete__(this->palette);
    }
    this->palette = (byte *)0x0;
    local_11 = 0;
    for (local_18 = 0x30; local_18 < 0x70; local_18 = local_18 + 1) {
      local_11 = local_11 | (this->h).banks[local_18];
    }
    if (((this->h).ramReq == '\0') && (local_11 != 0)) {
      Error("[SAVENEX] 2MB bank (48..111) stored without 2MbRamReq set in CFG",(char *)0x0,PASS3);
    }
  }
  return;
}

Assistant:

void SNexFile::finalizeFile() {
	if (nullptr == f) return;
	// do the final V1.2 / V1.3 updates to the header fields
	// V1.3 auto-detected when V1.2 is required should never happen (Error should be unreachable)
	if (3 == minFileVersion && 2 == reqFileVersion) Error("[SAVENEX] V1.3?!", NULL, FATAL);
	updateIfAheadFirstBankSave();	// if no BANK/AUTO/CLOSE was used -> update all now
	if (2 == minFileVersion) {
		h.banksOffset = 0;		// clear banksOffset for V1.2 files
		h.bigL2barPosY = 0;		// clear big Layer 2 loading-bar posY for V1.2 files
	} else {
		h.magicAndVersion[7] = '3';				// modify file version to "V1.3" string
		calculateCrc32C();
	}
	// refresh the file header to final state
	writeHeader();
	// close the file
	fclose(f);
	f = nullptr;
	canAppend = false;
	if (nullptr != copper) delete[] copper;
	copper = nullptr;
	if (nullptr != palette) delete[] palette;
	palette = nullptr;
	// check if there were banks 48+, but 2MB required was not set
	byte hasExtendedBank = 0;
	for (int i = 48; i < SNexHeader::MAX_BANK; ++i) hasExtendedBank |= h.banks[i];
	if (!h.ramReq && hasExtendedBank) {
		Error("[SAVENEX] 2MB bank (48..111) stored without 2MbRamReq set in CFG");
	}
	return;
}